

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShadingLanguage420PackTests.cpp
# Opt level: O0

void __thiscall
gl4cts::GLSL420Pack::BindingUniformBlockArrayTest::releaseResource
          (BindingUniformBlockArrayTest *this)

{
  uint local_8c;
  GLuint i;
  buffer *buffers [14];
  BindingUniformBlockArrayTest *this_local;
  
  buffers[0] = &this->m_goku_01_buffer;
  buffers[1] = &this->m_goku_02_buffer;
  buffers[2] = &this->m_goku_03_buffer;
  buffers[3] = &this->m_goku_04_buffer;
  buffers[4] = &this->m_goku_05_buffer;
  buffers[5] = &this->m_goku_06_buffer;
  buffers[6] = &this->m_goku_07_buffer;
  buffers[7] = &this->m_goku_08_buffer;
  buffers[8] = &this->m_goku_09_buffer;
  buffers[9] = &this->m_goku_10_buffer;
  buffers[10] = &this->m_goku_11_buffer;
  buffers[0xb] = &this->m_goku_12_buffer;
  buffers[0xc] = &this->m_goku_13_buffer;
  for (local_8c = 0; local_8c < 0xe; local_8c = local_8c + 1) {
    Utils::buffer::release(buffers[(ulong)local_8c - 1]);
  }
  return;
}

Assistant:

void BindingUniformBlockArrayTest::releaseResource()
{
	Utils::buffer* buffers[14] = { &m_goku_00_buffer, &m_goku_01_buffer, &m_goku_02_buffer, &m_goku_03_buffer,
								   &m_goku_04_buffer, &m_goku_05_buffer, &m_goku_06_buffer, &m_goku_07_buffer,
								   &m_goku_08_buffer, &m_goku_09_buffer, &m_goku_10_buffer, &m_goku_11_buffer,
								   &m_goku_12_buffer, &m_goku_13_buffer };

	for (GLuint i = 0; i < 14; ++i)
	{
		buffers[i]->release();
	}
}